

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse.c
# Opt level: O2

void mod2sparse_clear(mod2sparse *r)

{
  long lVar1;
  int iVar2;
  mod2entry *pmVar3;
  mod2block *__ptr;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  
  iVar2 = r->n_rows;
  lVar5 = 0;
  for (lVar7 = 0; lVar7 < iVar2; lVar7 = lVar7 + 1) {
    pmVar3 = r->rows;
    lVar1 = (long)&pmVar3->row + lVar5;
    *(long *)((long)&pmVar3->down + lVar5) = lVar1;
    *(long *)((long)&pmVar3->up + lVar5) = lVar1;
    *(long *)((long)&pmVar3->right + lVar5) = lVar1;
    *(long *)((long)&pmVar3->left + lVar5) = lVar1;
    lVar5 = lVar5 + 0x38;
  }
  uVar4 = 0;
  uVar6 = (ulong)(uint)r->n_cols;
  if (r->n_cols < 1) {
    uVar6 = uVar4;
  }
  for (; uVar6 * 0x38 - uVar4 != 0; uVar4 = uVar4 + 0x38) {
    pmVar3 = r->cols;
    lVar5 = (long)&pmVar3->row + uVar4;
    *(long *)((long)&pmVar3->down + uVar4) = lVar5;
    *(long *)((long)&pmVar3->up + uVar4) = lVar5;
    *(long *)((long)&pmVar3->right + uVar4) = lVar5;
    *(long *)((long)&pmVar3->left + uVar4) = lVar5;
  }
  while (__ptr = r->blocks, __ptr != (mod2block *)0x0) {
    r->blocks = __ptr->next;
    free(__ptr);
  }
  return;
}

Assistant:

void mod2sparse_clear
( mod2sparse *r
)
{
  mod2block *b;
  mod2entry *e;
  int i, j;

  for (i = 0; i<mod2sparse_rows(r); i++)
  { e = &r->rows[i];
    e->left = e->right = e->up = e->down = e;
  }

  for (j = 0; j<mod2sparse_cols(r); j++)
  { e = &r->cols[j];
    e->left = e->right = e->up = e->down = e;
  }

  while (r->blocks!=0)
  { b = r->blocks;
    r->blocks = b->next;
    free(b);
  }
}